

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListAggregatesBind<false>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  _func_int **pp_Var8;
  reference pvVar9;
  pointer pEVar10;
  LogicalType *pLVar11;
  Catalog *this_00;
  reference pvVar12;
  idx_t offset;
  BoundConstantExpression *this_01;
  pointer pBVar13;
  FunctionData this_02;
  BinderException *this_03;
  InvalidInputException *pIVar14;
  long lVar15;
  idx_t i;
  size_type sVar16;
  aggregate_size_t *pp_Var17;
  undefined8 *puVar18;
  AggregateFunctionSet *this_04;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var19;
  byte bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  bound_aggr_function;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  optional_idx best_function_idx;
  string function_name;
  vector<duckdb::LogicalType,_true> types;
  FunctionBinder function_binder;
  FunctionBinder function_binder_1;
  ErrorData error;
  AggregateFunction aggr_function;
  AggregateFunction best_function;
  FunctionBinder local_5b0;
  long *local_5a0;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_588;
  LogicalType local_580;
  Expression *local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  Value local_550;
  optional_idx local_510;
  string local_508;
  undefined1 local_4e8 [20];
  undefined4 uStack_4d4;
  LogicalType local_458;
  FunctionStability local_440;
  FunctionNullHandling FStack_43f;
  FunctionErrors FStack_43e;
  FunctionCollationHandling FStack_43d;
  undefined8 auStack_438 [14];
  element_type *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  LogicalType local_3a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  FunctionBinder local_350;
  undefined1 local_340 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  char local_2f8 [16];
  pointer local_2e8;
  pointer local_2e0;
  undefined1 local_2d8 [72];
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  bVar20 = 0;
  local_588._M_head_impl = (FunctionData *)this;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_5b0.context =
       (ClientContext *)
       (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_4e8,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_5b0.context);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  uVar6 = local_4e8._0_8_;
  local_4e8._0_8_ = (_func_int **)0x0;
  _Var2._M_head_impl =
       (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar6;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_func_int **)local_4e8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_4e8._0_8_ + 8))();
  }
  local_4e8._0_8_ = (_func_int **)0x0;
  if (local_5b0.context != (ClientContext *)0x0) {
    (*((BaseExpression *)&(local_5b0.context)->super_enable_shared_from_this<duckdb::ClientContext>)
      ->_vptr_BaseExpression[1])();
  }
  local_5b0.context = (ClientContext *)0x0;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  _Var19._M_head_impl = local_588._M_head_impl;
  if ((pEVar10->return_type).id_ == SQLNULL) {
    ListAggregatesBindFailure((duckdb *)local_588._M_head_impl,bound_function);
  }
  else {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar9);
    LVar1 = (pEVar10->return_type).id_;
    LogicalType::LogicalType(&local_580);
    if (LVar1 == UNKNOWN) {
      LogicalType::LogicalType((LogicalType *)local_4e8,ANY);
      uVar6 = local_4e8._0_8_;
      stack0xfffffffffffffb28 =
           local_580.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_4e8._8_8_ =
           local_580.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_580.id_ = (LogicalTypeId)local_4e8[0];
      local_580.physical_type_ = local_4e8[1];
      local_4e8._0_8_ = uVar6;
      LogicalType::~LogicalType((LogicalType *)local_4e8);
    }
    else {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar9);
      if ((pEVar10->return_type).id_ != LIST) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar9);
        if ((pEVar10->return_type).id_ != MAP) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_4e8._0_8_ = local_4e8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4e8,
                     "First argument of list aggregate must be a list, map or array","");
          InvalidInputException::InvalidInputException(pIVar14,(string *)local_4e8);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
      }
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar9);
      pLVar11 = ListType::GetChildType(&pEVar10->return_type);
      if (&local_580 != pLVar11) {
        local_580.id_ = pLVar11->id_;
        local_580.physical_type_ = pLVar11->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_580.type_info_,&pLVar11->type_info_);
      }
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"histogram","");
    this_00 = Catalog::GetSystemCatalog(context);
    local_4e8._0_8_ = local_4e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"main","");
    local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)
         Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                   (this_00,context,(string *)local_4e8,&local_508,THROW_EXCEPTION,
                    (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> *)&local_160);
    pp_Var8 = local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
    if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_);
    }
    if (LVar1 == UNKNOWN) {
      LogicalType::LogicalType((LogicalType *)local_4e8,UNKNOWN);
      pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                          (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                            arguments,0);
      uVar7 = stack0xfffffffffffffb28;
      uVar6 = local_4e8._8_8_;
      pvVar12->id_ = (LogicalTypeId)local_4e8[0];
      pvVar12->physical_type_ = local_4e8[1];
      uVar21 = *(undefined4 *)
                &(pvVar12->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(pvVar12->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar23 = *(undefined4 *)
                &(pvVar12->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(pvVar12->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4e8._8_8_ = (element_type *)0x0;
      stack0xfffffffffffffb28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (pvVar12->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar6;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_598 = uVar21;
        uStack_594 = uVar22;
        uStack_590 = uVar23;
        uStack_58c = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        uVar21 = local_598;
        uVar22 = uStack_594;
        uVar23 = uStack_590;
        uVar24 = uStack_58c;
      }
      uVar6 = stack0xfffffffffffffb28;
      local_4e8._12_4_ = uVar22;
      local_4e8._8_4_ = uVar21;
      uStack_4d4 = uVar24;
      local_4e8._16_4_ = uVar23;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      LogicalType::~LogicalType((LogicalType *)local_4e8);
      LogicalType::LogicalType((LogicalType *)local_4e8,SQLNULL);
      uVar7 = stack0xfffffffffffffb28;
      uVar6 = local_4e8._8_8_;
      (bound_function->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_4e8[0];
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_4e8[1];
      uVar21 = *(undefined4 *)
                &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar23 = *(undefined4 *)
                &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4e8._8_8_ = (element_type *)0x0;
      stack0xfffffffffffffb28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar6;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_598 = uVar21;
        uStack_594 = uVar22;
        uStack_590 = uVar23;
        uStack_58c = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        uVar21 = local_598;
        uVar22 = uStack_594;
        uVar23 = uStack_590;
        uVar24 = uStack_58c;
      }
      uVar6 = stack0xfffffffffffffb28;
      _Var19._M_head_impl = local_588._M_head_impl;
      local_4e8._12_4_ = uVar22;
      local_4e8._8_4_ = uVar21;
      uStack_4d4 = uVar24;
      local_4e8._16_4_ = uVar23;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      LogicalType::~LogicalType((LogicalType *)local_4e8);
      (_Var19._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
    }
    else {
      ErrorData::ErrorData((ErrorData *)(local_340 + 0x30));
      local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_3b8,&local_580);
      if (0x10 < (ulong)((long)(arguments->
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(arguments->
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar16 = 2;
        do {
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](arguments,sVar16);
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar9);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_3b8,&pEVar10->return_type);
          sVar16 = sVar16 + 1;
        } while (sVar16 < (ulong)((long)(arguments->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(arguments->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      FunctionBinder::FunctionBinder(&local_350,context);
      this_04 = (AggregateFunctionSet *)((long)pp_Var8 + 0x158);
      local_510 = FunctionBinder::BindFunction
                            (&local_350,
                             &(((FunctionEntry *)pp_Var8)->super_StandardEntry).super_InCatalogEntry
                              .super_CatalogEntry.name,this_04,
                             (vector<duckdb::LogicalType,_true> *)&local_3b8,
                             (ErrorData *)(local_340 + 0x30));
      if (local_510.index == 0xffffffffffffffff) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_4e8._0_8_ = local_4e8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4e8,"No matching aggregate function\n%s","");
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_2e8,&local_2e0->id_ + (long)local_2e8);
        BinderException::BinderException<std::__cxx11::string>
                  (this_03,(string *)local_4e8,&local_370);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      offset = optional_idx::GetIndex(&local_510);
      FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                (&local_160,(FunctionSet<duckdb::AggregateFunction> *)this_04,offset);
      HistogramFun::GetHistogramUnorderedMap(&local_290,&local_580);
      local_568 = (Expression *)0x0;
      uStack_560 = 0;
      local_558 = 0;
      LogicalType::LogicalType(&local_3a0,&local_580);
      Value::Value(&local_550,&local_3a0);
      this_01 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value((Value *)local_4e8,&local_550);
      BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_4e8);
      Value::~Value((Value *)local_4e8);
      Value::~Value(&local_550);
      LogicalType::~LogicalType(&local_3a0);
      local_4e8._0_8_ = this_01;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_568,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_4e8);
      if ((BoundConstantExpression *)local_4e8._0_8_ != (BoundConstantExpression *)0x0) {
        (**(code **)(*(long *)local_4e8._0_8_ + 8))();
      }
      if (0x10 < (ulong)((long)(arguments->
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(arguments->
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar16 = 2;
        do {
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](arguments,sVar16);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_568,pvVar9);
          sVar16 = sVar16 + 1;
        } while (sVar16 < (ulong)((long)(arguments->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(arguments->
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::resize((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)arguments,2);
      }
      FunctionBinder::FunctionBinder((FunctionBinder *)local_340,context);
      SimpleFunction::SimpleFunction((SimpleFunction *)local_4e8,(SimpleFunction *)&local_290);
      local_4e8._0_8_ = &PTR__BaseScalarFunction_02474b40;
      LogicalType::LogicalType(&local_458,&local_290.super_BaseScalarFunction.return_type);
      local_440 = local_290.super_BaseScalarFunction.stability;
      FStack_43f = local_290.super_BaseScalarFunction.null_handling;
      FStack_43e = local_290.super_BaseScalarFunction.errors;
      FStack_43d = local_290.super_BaseScalarFunction.collation_handling;
      local_4e8._0_8_ = &PTR__AggregateFunction_02477a08;
      pp_Var17 = &local_290.state_size;
      puVar18 = auStack_438;
      for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar18 = *pp_Var17;
        pp_Var17 = pp_Var17 + (ulong)bVar20 * -2 + 1;
        puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
      }
      auStack_438[0xd]._0_1_ = local_290.order_dependent;
      auStack_438[0xd]._1_1_ = local_290.distinct_dependent;
      local_3c8 = local_290.function_info.internal.
                  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_3c0 = local_290.function_info.internal.
                  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_290.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_290.function_info.internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_290.function_info.internal.
                super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_290.function_info.internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_290.function_info.internal.
                super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_388._M_head_impl = local_568;
      uStack_380 = uStack_560;
      local_378 = local_558;
      local_568 = (Expression *)0x0;
      uStack_560 = 0;
      local_558 = 0;
      local_5a0 = (long *)0x0;
      FunctionBinder::BindAggregateFunction
                (&local_5b0,(AggregateFunction *)local_340,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_4e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_388,(AggregateType)&local_5a0);
      if (local_5a0 != (long *)0x0) {
        (**(code **)(*local_5a0 + 8))();
      }
      local_5a0 = (long *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_388);
      local_4e8._0_8_ = &PTR__AggregateFunction_02477a08;
      if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_4e8);
      pBVar13 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                              *)&local_5b0);
      pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                          (&(pBVar13->function).super_BaseScalarFunction.super_SimpleFunction.
                            arguments,0);
      LogicalType::LIST(&local_550.type_,pvVar12);
      pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                          (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                            arguments,0);
      _Var5._M_pi = local_550.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar4 = local_550.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pvVar12->id_ = local_550.type_.id_;
      pvVar12->physical_type_ = local_550.type_.physical_type_;
      uVar21 = *(undefined4 *)
                &(pvVar12->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(pvVar12->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar23 = *(undefined4 *)
                &(pvVar12->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(pvVar12->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (pvVar12->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      (pvVar12->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_598 = uVar21;
        uStack_594 = uVar22;
        uStack_590 = uVar23;
        uStack_58c = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        uVar21 = local_598;
        uVar22 = uStack_594;
        uVar23 = uStack_590;
        uVar24 = uStack_58c;
      }
      _Var5._M_pi = local_550.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar22,uVar21);
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar24;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar23;
      if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
      LogicalType::~LogicalType(&local_550.type_);
      pBVar13 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                              *)&local_5b0);
      if (8 < (ulong)((long)(pBVar13->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pBVar13->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_550.type_._0_8_ =
             &local_550.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_550,
                   "Aggregate function %s is not supported for list_aggr: extra arguments were not removed during bind"
                   ,"");
        pBVar13 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                                *)&local_5b0);
        (*(pBVar13->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                  (local_340 + 0x10,pBVar13);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar14,(string *)&local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_340 + 0x10));
        __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_02._vptr_FunctionData = (_func_int **)operator_new(0x28);
      local_550.type_._0_8_ = local_5b0.binder.ptr;
      local_5b0.binder.ptr = (Binder *)0x0;
      ListAggregatesBindData::ListAggregatesBindData
                ((ListAggregatesBindData *)this_02._vptr_FunctionData,
                 &(bound_function->super_BaseScalarFunction).return_type,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_550);
      _Var19._M_head_impl = (FunctionData *)local_588;
      if ((Binder *)local_550.type_._0_8_ != (Binder *)0x0) {
        (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                     &((BaseExpression *)local_550.type_._0_8_)->_vptr_BaseExpression)->internal).
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      *_Var19._M_head_impl = (FunctionData)this_02._vptr_FunctionData;
      if (local_5b0.binder.ptr != (Binder *)0x0) {
        (*(code *)((((local_5b0.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_568);
      local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_02477a08;
      if (local_290.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_290.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_02477a08;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_2d8 + 0x10));
      if (local_2e8 != (pointer)local_2d8) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
    LogicalType::~LogicalType(&local_580);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var19._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListAggregatesBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	if (arguments[0]->return_type.id() == LogicalTypeId::SQLNULL) {
		return ListAggregatesBindFailure(bound_function);
	}

	bool is_parameter = arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN;
	LogicalType child_type;
	if (is_parameter) {
		child_type = LogicalType::ANY;
	} else if (arguments[0]->return_type.id() == LogicalTypeId::LIST ||
	           arguments[0]->return_type.id() == LogicalTypeId::MAP) {
		child_type = ListType::GetChildType(arguments[0]->return_type);
	} else {
		// Unreachable
		throw InvalidInputException("First argument of list aggregate must be a list, map or array");
	}

	string function_name = "histogram";
	if (IS_AGGR) { // get the name of the aggregate function
		if (!arguments[1]->IsFoldable()) {
			throw InvalidInputException("Aggregate function name must be a constant");
		}
		// get the function name
		Value function_value = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		function_name = function_value.ToString();
	}

	// look up the aggregate function in the catalog
	auto &func = Catalog::GetSystemCatalog(context).GetEntry<AggregateFunctionCatalogEntry>(context, DEFAULT_SCHEMA,
	                                                                                        function_name);
	D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

	if (is_parameter) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		return nullptr;
	}

	// find a matching aggregate function
	ErrorData error;
	vector<LogicalType> types;
	types.push_back(child_type);
	// push any extra arguments into the type list
	for (idx_t i = 2; i < arguments.size(); i++) {
		types.push_back(arguments[i]->return_type);
	}

	FunctionBinder function_binder(context);
	auto best_function_idx = function_binder.BindFunction(func.name, func.functions, types, error);
	if (!best_function_idx.IsValid()) {
		throw BinderException("No matching aggregate function\n%s", error.Message());
	}

	// found a matching function, bind it as an aggregate
	auto best_function = func.functions.GetFunctionByOffset(best_function_idx.GetIndex());
	if (IS_AGGR) {
		bound_function.errors = best_function.errors;
		return ListAggregatesBindFunction<IS_AGGR>(context, bound_function, child_type, best_function, arguments);
	}

	// create the unordered map histogram function
	D_ASSERT(best_function.arguments.size() == 1);
	auto aggr_function = HistogramFun::GetHistogramUnorderedMap(child_type);
	return ListAggregatesBindFunction<IS_AGGR>(context, bound_function, child_type, aggr_function, arguments);
}